

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O3

void aom_noise_tx_add_energy(aom_noise_tx_t *noise_tx,float *psd)

{
  uint uVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  int xb;
  ulong uVar5;
  
  uVar1 = noise_tx->block_size;
  lVar2 = (long)(int)uVar1;
  if (0 < lVar2) {
    pfVar3 = noise_tx->tx_block + 1;
    lVar4 = 0;
    do {
      uVar5 = 0;
      do {
        psd[uVar5] = pfVar3[uVar5 * 2 + -1] * pfVar3[uVar5 * 2 + -1] +
                     pfVar3[uVar5 * 2] * pfVar3[uVar5 * 2] + psd[uVar5];
        uVar5 = uVar5 + 1;
      } while ((uVar1 >> 1) + 1 != uVar5);
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + lVar2 * 2;
      psd = psd + lVar2;
    } while (lVar4 != lVar2);
  }
  return;
}

Assistant:

void aom_noise_tx_add_energy(const struct aom_noise_tx_t *noise_tx,
                             float *psd) {
  const int block_size = noise_tx->block_size;
  for (int yb = 0; yb < block_size; ++yb) {
    for (int xb = 0; xb <= block_size / 2; ++xb) {
      float *c = noise_tx->tx_block + 2 * (yb * block_size + xb);
      psd[yb * block_size + xb] += c[0] * c[0] + c[1] * c[1];
    }
  }
}